

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANAplanner.cpp
# Opt level: O2

void __thiscall
anaPlanner::UpdateSuccs(anaPlanner *this,anaState *state,anaSearchStateSpace_t *pSearchStateSpace)

{
  int iVar1;
  DiscreteSpaceInformation *pDVar2;
  AbstractSearchState *AbstractSearchState;
  bool bVar3;
  CMDPSTATE *pCVar4;
  int sind;
  long lVar5;
  uint uVar6;
  vector<int,_std::allocator<int>_> SuccIDV;
  vector<int,_std::allocator<int>_> CostV;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  CKey local_88;
  CKey local_78;
  _Vector_base<int,_std::allocator<int>_> local_68;
  double local_48;
  
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar2 = (this->super_SBPLPlanner).environment_;
  (*pDVar2->_vptr_DiscreteSpaceInformation[5])(pDVar2,(ulong)**(uint **)(state + 0x18));
  for (lVar5 = 0;
      lVar5 < (int)((ulong)((long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_a8._M_impl.super__Vector_impl_data._M_start) >> 2);
      lVar5 = lVar5 + 1) {
    pCVar4 = GetState(this,local_a8._M_impl.super__Vector_impl_data._M_start[lVar5],
                      pSearchStateSpace);
    iVar1 = local_68._M_impl.super__Vector_impl_data._M_start[lVar5];
    AbstractSearchState = (AbstractSearchState *)pCVar4->PlannerSpecificData;
    if (*(unsigned_short *)((long)&AbstractSearchState[1].heapindex + 2) !=
        pSearchStateSpace->callnumber) {
      ReInitializeSearchStateInfo(this,(anaState *)AbstractSearchState,pSearchStateSpace);
    }
    uVar6 = iVar1 + *(int *)(state + 0x24);
    if ((uVar6 < *(uint *)((long)AbstractSearchState[1].listelem + 0xc)) &&
       (AbstractSearchState[2].StateType + uVar6 < pSearchStateSpace->G)) {
      *(uint *)((long)AbstractSearchState[1].listelem + 0xc) = uVar6;
      AbstractSearchState[2].listelem[0] = *(listelement **)(state + 0x18);
      local_48 = get_e_value(this,pSearchStateSpace,
                             *(int *)&AbstractSearchState[1].listelem[0]->liststate);
      bVar3 = CHeap::inheap(pSearchStateSpace->heap,AbstractSearchState);
      if (bVar3) {
        local_78.key[1] = 0;
        local_78.key[0] = (long)-local_48;
        CHeap::updateheap(pSearchStateSpace->heap,AbstractSearchState,&local_78);
      }
      else {
        local_88.key[1] = 0;
        local_88.key[0] = (long)-local_48;
        CHeap::insertheap(pSearchStateSpace->heap,AbstractSearchState,&local_88);
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
  return;
}

Assistant:

void anaPlanner::UpdateSuccs(anaState* state, anaSearchStateSpace_t* pSearchStateSpace)
{
    vector<int> SuccIDV;
    vector<int> CostV;
    CKey key;
    anaState *n;

    environment_->GetSuccs(state->MDPstate->StateID, &SuccIDV, &CostV);

    //iterate through predecessors of s
    for (int sind = 0; sind < (int)SuccIDV.size(); sind++) {
        CMDPSTATE* SuccMDPState = GetState(SuccIDV[sind], pSearchStateSpace);
        int cost = CostV[sind];

        n = (anaState*)(SuccMDPState->PlannerSpecificData);
        if (n->callnumberaccessed != pSearchStateSpace->callnumber) ReInitializeSearchStateInfo(n, pSearchStateSpace);

        //see if we can improve the value of n
        //taking into account the cost of action
        if ((n->g > state->g + cost) && ((state->g + cost + n->h) < pSearchStateSpace->G)) {
            n->g = state->g + cost;
            n->bestpredstate = state->MDPstate;

            key.key[0] = (long)-get_e_value(pSearchStateSpace, n->MDPstate->StateID);
            /*if(key.key[0] >= -1) {
             printf("inserting on Open with key =%d\n", key.key[0]);
             }*/
            if (pSearchStateSpace->heap->inheap(n)) {
                pSearchStateSpace->heap->updateheap(n, key);
            }
            else {
                pSearchStateSpace->heap->insertheap(n, key);
            }
        }
    }
}